

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::preDraw
          (SampleMaskUniqueSetCase *this)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 uVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  long lVar3;
  
  iVar1 = (*((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar3 + 0xb48))
                    ((((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                       super_MultisampleRenderCase.m_program)->m_program).m_program,"u_bitSelector")
  ;
  (**(code **)(lVar3 + 0x1500))
            (uVar2,(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                   super_MultisampleRenderCase.m_iteration);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"set u_bitSelector",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                  ,0x6a1);
  local_190._0_8_ =
       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
        super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Setting u_bitSelector = ",0x18);
  std::ostream::operator<<
            (this_00,(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                     super_MultisampleRenderCase.m_iteration);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_118);
  SampleMaskBaseCase::preDraw(&this->super_SampleMaskBaseCase);
  return;
}

Assistant:

void SampleMaskUniqueSetCase::preDraw (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				selectorLoc	= gl.getUniformLocation(m_program->getProgram(), "u_bitSelector");

	gl.uniform1ui(selectorLoc, (deUint32)m_iteration);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set u_bitSelector");

	m_testCtx.getLog() << tcu::TestLog::Message << "Setting u_bitSelector = " << m_iteration << tcu::TestLog::EndMessage;

	SampleMaskBaseCase::preDraw();
}